

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,TouchPoint *p)

{
  qreal *this;
  undefined8 uVar1;
  QDebug *pQVar2;
  int *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebug local_70;
  QDebug local_68;
  QPointF local_60;
  QDebug local_50;
  undefined1 local_48 [8];
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_40,(QDebug *)p);
  *(undefined1 *)(*(long *)p + 0x30) = 0;
  pQVar2 = QDebug::operator<<((QDebug *)p,"TouchPoint(");
  pQVar2 = QDebug::operator<<(pQVar2,*in_RDX);
  pQVar2 = QDebug::operator<<(pQVar2," @");
  local_70.stream = pQVar2->stream;
  (local_70.stream)->ref = (local_70.stream)->ref + 1;
  operator<<((QDebug *)&local_68,(QRectF *)&local_70);
  pQVar2 = QDebug::operator<<(&local_68," normalized ");
  local_60.xp = (qreal)pQVar2->stream;
  ((Stream *)local_60.xp)->ref = ((Stream *)local_60.xp)->ref + 1;
  this = &local_60.yp;
  operator<<((QDebug *)this,&local_60);
  pQVar2 = QDebug::operator<<((QDebug *)this," press ");
  pQVar2 = QDebug::operator<<(pQVar2,*(double *)(in_RDX + 0x10));
  pQVar2 = QDebug::operator<<(pQVar2," vel ");
  local_50.stream = pQVar2->stream;
  (local_50.stream)->ref = (local_50.stream)->ref + 1;
  operator<<((Stream *)local_48,(QVector2D)*(float (*) [2])(in_RDX + 0x15));
  pQVar2 = QDebug::operator<<((QDebug *)local_48," state ");
  QDebug::operator<<(pQVar2,(uint)*(byte *)(in_RDX + 0x14));
  QDebug::~QDebug((QDebug *)local_48);
  QDebug::~QDebug(&local_50);
  QDebug::~QDebug((QDebug *)this);
  QDebug::~QDebug((QDebug *)&local_60);
  QDebug::~QDebug(&local_68);
  QDebug::~QDebug(&local_70);
  uVar1 = *(undefined8 *)p;
  *(undefined8 *)p = 0;
  *(undefined8 *)dbg.stream = uVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug dbg, const QWindowSystemInterface::TouchPoint &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "TouchPoint(" << p.id << " @" << p.area << " normalized " << p.normalPosition
                  << " press " << p.pressure << " vel " << p.velocity << " state " << (int)p.state;
    return dbg;
}